

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_heap.c
# Opt level: O2

void vmcache_heap_remove(heap *heap,extent *ext)

{
  ptr_ext_t *ppVar1;
  long lVar2;
  long lVar3;
  
  ppVar1 = ext->ptr;
  lVar2 = *(long *)(ppVar1 + -0x18);
  if (lVar2 == 0) {
    lVar3 = *(long *)(ppVar1 + -0x10);
  }
  else {
    lVar3 = *(long *)(ppVar1 + -0x10);
    *(long *)(lVar2 + -0x10) = lVar3;
  }
  if (lVar3 != 0) {
    *(long *)(lVar3 + -0x18) = lVar2;
  }
  if (heap->first_extent == ppVar1) {
    heap->first_extent = *(ptr_ext_t **)(ppVar1 + -0x18);
  }
  heap->entries = heap->entries - 1;
  return;
}

Assistant:

static void
vmcache_heap_remove(struct heap *heap, struct extent *ext)
{
	LOG(3, "heap %p ext %p", heap, ext);

	struct header *header = vmcache_extent_get_header(ext->ptr);

	ASSERT(header->next || header->prev ||
			(heap->first_extent == ext->ptr));

	if (header->next) {
		struct header *header_next =
				vmcache_extent_get_header(header->next);
		ASSERTeq(header_next->prev, ext->ptr);
		header_next->prev = header->prev;
	}

	if (header->prev) {
		struct header *header_prev =
				vmcache_extent_get_header(header->prev);
		ASSERTeq(header_prev->next, ext->ptr);
		header_prev->next = header->next;
	}

	if (heap->first_extent == ext->ptr)
		heap->first_extent = header->next;

#ifdef STATS_ENABLED
	heap->entries--;
#endif
}